

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_enc.c
# Opt level: O3

void VP8StoreFilterStats(VP8EncIterator *it)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  VP8Encoder *pVVar5;
  uint8_t *__dest;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  undefined1 uVar14;
  double dVar15;
  
  uVar7 = *(byte *)it->mb_ >> 5 & 3;
  iVar2 = it->enc_->dqm_[uVar7].quant_;
  if (((*(byte *)it->mb_ & 0x13) != 0x11) && (it->lf_stats_ != (LFStats *)0x0)) {
    iVar3 = it->enc_->dqm_[uVar7].fstrength_;
    dVar15 = GetMBSSIM(it->yuv_in_,it->yuv_out_);
    *(double *)((long)(*it->lf_stats_)[0] + (ulong)(uVar7 << 9)) =
         dVar15 + *(double *)((long)(*it->lf_stats_)[0] + (ulong)(uVar7 << 9));
    if (-1 < iVar2) {
      iVar12 = -iVar2;
      iVar8 = (uint)(1 < iVar2) * 3 + 1;
      iVar10 = iVar3 * 2 + iVar2 * -2;
      do {
        if (0xffffffc0 < (iVar3 + iVar12) - 0x40U) {
          uVar11 = iVar3 + iVar12;
          pVVar5 = it->enc_;
          uVar4 = pVVar5->config_->filter_sharpness;
          uVar13 = uVar11;
          if (0 < (int)uVar4) {
            uVar9 = uVar11 >> (2U - (uVar4 < 5) & 0x1f);
            uVar13 = 9 - uVar4;
            if ((int)uVar9 < (int)(9 - uVar4)) {
              uVar13 = uVar9;
            }
          }
          if ((int)uVar13 < 2) {
            uVar13 = 1;
          }
          iVar1 = uVar13 + iVar10;
          __dest = it->yuv_out2_;
          memcpy(__dest,it->yuv_out_,0x200);
          if ((pVVar5->filter_hdr_).simple_ == 1) {
            (*VP8SimpleHFilter16i)(__dest,0x20,iVar1);
            (*VP8SimpleVFilter16i)(__dest,0x20,iVar1);
          }
          else {
            uVar14 = 0xe < uVar11;
            if (0x27 < uVar11) {
              uVar14 = 2;
            }
            iVar6 = (int)uVar14;
            (*VP8HFilter16i)(__dest,0x20,iVar1,uVar13,iVar6);
            (*VP8HFilter8i)(__dest + 0x10,__dest + 0x18,0x20,iVar1,uVar13,iVar6);
            (*VP8VFilter16i)(__dest,0x20,iVar1,uVar13,iVar6);
            (*VP8VFilter8i)(__dest + 0x10,__dest + 0x18,0x20,iVar1,uVar13,iVar6);
          }
          dVar15 = GetMBSSIM(it->yuv_in_,it->yuv_out2_);
          *(double *)((long)(*it->lf_stats_)[0] + (ulong)uVar11 * 8 + (ulong)(uVar7 << 9)) =
               dVar15 + *(double *)
                         ((long)(*it->lf_stats_)[0] + (ulong)uVar11 * 8 + (ulong)(uVar7 << 9));
        }
        iVar12 = iVar12 + iVar8;
        iVar10 = iVar10 + iVar8 * 2;
      } while (iVar12 <= iVar2);
    }
  }
  return;
}

Assistant:

void VP8StoreFilterStats(VP8EncIterator* const it) {
#if !defined(WEBP_REDUCE_SIZE)
  int d;
  VP8Encoder* const enc = it->enc_;
  const int s = it->mb_->segment_;
  const int level0 = enc->dqm_[s].fstrength_;

  // explore +/-quant range of values around level0
  const int delta_min = -enc->dqm_[s].quant_;
  const int delta_max = enc->dqm_[s].quant_;
  const int step_size = (delta_max - delta_min >= 4) ? 4 : 1;

  if (it->lf_stats_ == NULL) return;

  // NOTE: Currently we are applying filter only across the sublock edges
  // There are two reasons for that.
  // 1. Applying filter on macro block edges will change the pixels in
  // the left and top macro blocks. That will be hard to restore
  // 2. Macro Blocks on the bottom and right are not yet compressed. So we
  // cannot apply filter on the right and bottom macro block edges.
  if (it->mb_->type_ == 1 && it->mb_->skip_) return;

  // Always try filter level  zero
  (*it->lf_stats_)[s][0] += GetMBSSIM(it->yuv_in_, it->yuv_out_);

  for (d = delta_min; d <= delta_max; d += step_size) {
    const int level = level0 + d;
    if (level <= 0 || level >= MAX_LF_LEVELS) {
      continue;
    }
    DoFilter(it, level);
    (*it->lf_stats_)[s][level] += GetMBSSIM(it->yuv_in_, it->yuv_out2_);
  }
#else  // defined(WEBP_REDUCE_SIZE)
  (void)it;
#endif  // !defined(WEBP_REDUCE_SIZE)
}